

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Chapters::Atom::ExpandDisplaysArray(Atom *this)

{
  Display *pDVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  Display *this_00;
  ulong uVar6;
  Display *local_a8;
  Display *local_80;
  int local_74;
  int local_68;
  int idx;
  Display *displays;
  int size;
  Atom *this_local;
  
  if (this->m_displays_count < this->m_displays_size) {
    this_local._7_1_ = true;
  }
  else {
    if (this->m_displays_size == 0) {
      local_74 = 1;
    }
    else {
      local_74 = this->m_displays_size << 1;
    }
    uVar3 = (ulong)local_74;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(0x18),0);
    uVar6 = uVar4 + 8;
    if (SUB168(auVar2 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    local_80 = (Display *)0x0;
    if (puVar5 != (ulong *)0x0) {
      *puVar5 = uVar3;
      local_80 = (Display *)(puVar5 + 1);
      if (uVar3 != 0) {
        local_a8 = local_80;
        do {
          Display::Display(local_a8);
          local_a8 = local_a8 + 1;
        } while (local_a8 != local_80 + uVar3);
      }
    }
    if (local_80 == (Display *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      for (local_68 = 0; local_68 < this->m_displays_count; local_68 = local_68 + 1) {
        Display::ShallowCopy(this->m_displays + local_68,local_80 + local_68);
      }
      pDVar1 = this->m_displays;
      if (pDVar1 != (Display *)0x0) {
        this_00 = pDVar1 + (long)pDVar1[-1].m_country;
        while (pDVar1 != this_00) {
          this_00 = this_00 + -1;
          Display::~Display(this_00);
        }
        operator_delete__(&pDVar1[-1].m_country);
      }
      this->m_displays = local_80;
      this->m_displays_size = local_74;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Chapters::Atom::ExpandDisplaysArray() {
  if (m_displays_size > m_displays_count)
    return true;  // nothing else to do

  const int size = (m_displays_size == 0) ? 1 : 2 * m_displays_size;

  Display* const displays = new (std::nothrow) Display[size];

  if (displays == NULL)
    return false;

  for (int idx = 0; idx < m_displays_count; ++idx) {
    m_displays[idx].ShallowCopy(displays[idx]);
  }

  delete[] m_displays;
  m_displays = displays;

  m_displays_size = size;
  return true;
}